

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

void __thiscall
ParamListStandard::restoreXml
          (ParamListStandard *this,Element *el,AddrSpaceManager *manage,
          vector<EffectRecord,_std::allocator<EffectRecord>_> *effectlist,bool normalstack)

{
  size_t *psVar1;
  uint *puVar2;
  char cVar3;
  int4 iVar4;
  Element *el_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  _List_node_base *p_Var8;
  LowlevelError *pLVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  pointer ppEVar14;
  pointer pbVar15;
  istringstream i1;
  string local_1b0 [3];
  ios_base local_138 [264];
  char *pcVar16;
  
  this->numgroup = 0;
  this->spacebase = (AddrSpace *)0x0;
  this->pointermax = 0;
  this->thisbeforeret = false;
  pbVar15 = (el->attr).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(el->attr).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15) >> 5) < 1) {
    bVar10 = false;
  }
  else {
    lVar12 = 0;
    lVar13 = 0;
    bVar10 = false;
    do {
      pcVar16 = (char *)((long)&(pbVar15->_M_dataplus)._M_p + lVar12);
      iVar6 = std::__cxx11::string::compare(pcVar16);
      if (iVar6 == 0) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_1b0,
                   (string *)
                   ((long)&(((el->value).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12)
                   ,_S_in);
        puVar2 = (uint *)((long)&local_1b0[0].field_2 +
                         *(long *)(local_1b0[0]._M_dataplus._M_p + -0x18) + 8);
        *puVar2 = *puVar2 & 0xffffffb5;
        std::istream::operator>>(local_1b0,&this->pointermax);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
      }
      else {
        iVar6 = std::__cxx11::string::compare(pcVar16);
        if (iVar6 == 0) {
          pbVar15 = (el->value).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&pbVar15->_M_string_length + lVar12) == 0) {
LAB_00256fa1:
            bVar5 = false;
          }
          else {
            cVar3 = **(char **)((long)&(pbVar15->_M_dataplus)._M_p + lVar12);
            bVar5 = true;
            if (((cVar3 != '1') && (cVar3 != 't')) && (cVar3 != 'y')) goto LAB_00256fa1;
          }
          this->thisbeforeret = bVar5;
        }
        else {
          iVar6 = std::__cxx11::string::compare(pcVar16);
          if (iVar6 == 0) {
            pbVar15 = (el->value).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (*(long *)((long)&pbVar15->_M_string_length + lVar12) != 0) {
              cVar3 = **(char **)((long)&(pbVar15->_M_dataplus)._M_p + lVar12);
              bVar10 = true;
              if (((cVar3 == '1') || (cVar3 == 't')) || (cVar3 == 'y')) goto LAB_00256fa6;
            }
            bVar10 = false;
          }
        }
      }
LAB_00256fa6:
      lVar13 = lVar13 + 1;
      pbVar15 = (el->attr).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x20;
    } while (lVar13 < (int)((ulong)((long)(el->attr).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15
                                   ) >> 5));
  }
  this->nonfloatgroup = -1;
  ppEVar14 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppEVar14 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar6 = -1;
    do {
      el_00 = *ppEVar14;
      iVar7 = std::__cxx11::string::compare((char *)el_00);
      if (iVar7 == 0) {
        iVar4 = this->numgroup;
        p_Var8 = (_List_node_base *)operator_new(0x48);
        *(int4 *)&p_Var8[1]._M_prev = iVar4;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar1 = &(this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        ParamEntry::restoreXml
                  ((ParamEntry *)
                   ((this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl.
                    _M_node.super__List_node_base._M_prev + 1),el_00,manage,normalstack);
        p_Var8 = (this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl.
                 _M_node.super__List_node_base._M_prev;
        if (*(int *)((long)&p_Var8[1]._M_next + 4) == 3) {
          if (-1 < this->nonfloatgroup) {
            pLVar9 = (LowlevelError *)__cxa_allocate_exception(0x20);
            local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,"parameter list floating-point entries must come first",
                       "");
            LowlevelError::LowlevelError(pLVar9,local_1b0);
            __cxa_throw(pLVar9,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
          }
        }
        else if (this->nonfloatgroup < 0) {
          this->nonfloatgroup = this->numgroup;
        }
        if (((AddrSpace *)p_Var8[2]._M_next)->type == 2) {
          this->spacebase = (AddrSpace *)p_Var8[2]._M_next;
        }
        else if (bVar10) {
          EffectRecord::EffectRecord((EffectRecord *)local_1b0,(ParamEntry *)(p_Var8 + 1),2);
          std::vector<EffectRecord,_std::allocator<EffectRecord>_>::emplace_back<EffectRecord>
                    (effectlist,(EffectRecord *)local_1b0);
        }
        p_Var8 = (this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl.
                 _M_node.super__List_node_base._M_prev;
        iVar7 = *(int *)&p_Var8[1]._M_prev;
        iVar11 = *(int *)((long)&p_Var8[1]._M_prev + 4) + iVar7;
        if (this->numgroup < iVar11) {
          this->numgroup = iVar11;
        }
        bVar5 = iVar7 < iVar6;
        iVar6 = iVar7;
        if (bVar5) {
          pLVar9 = (LowlevelError *)__cxa_allocate_exception(0x20);
          local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"pentrys must come in group order","");
          LowlevelError::LowlevelError(pLVar9,local_1b0);
          __cxa_throw(pLVar9,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
      }
      ppEVar14 = ppEVar14 + 1;
    } while (ppEVar14 !=
             (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  this->maxdelay = 0;
  p_Var8 = (this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var8 != (_List_node_base *)&this->entry) {
    iVar6 = 0;
    do {
      iVar7 = *(int *)((long)(p_Var8[2]._M_next + 6) + 4);
      if (iVar6 < iVar7) {
        this->maxdelay = iVar7;
        iVar6 = iVar7;
      }
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)&this->entry);
  }
  populateResolver(this);
  return;
}

Assistant:

void ParamListStandard::restoreXml(const Element *el,const AddrSpaceManager *manage,
				   vector<EffectRecord> &effectlist,bool normalstack)

{
  int4 lastgroup = -1;
  numgroup = 0;
  spacebase = (AddrSpace *)0;
  pointermax = 0;
  thisbeforeret = false;
  bool autokilledbycall = false;
  for(int4 i=0;i<el->getNumAttributes();++i) {
    const string &attrname( el->getAttributeName(i) );
    if (attrname == "pointermax") {
      istringstream i1(el->getAttributeValue(i));
      i1.unsetf(ios::dec | ios::hex | ios::oct);
      i1 >> pointermax;
    }
    else if (attrname == "thisbeforeretpointer") {
      thisbeforeret = xml_readbool( el->getAttributeValue(i) );
    }
    else if (attrname == "killedbycall") {
      autokilledbycall = xml_readbool( el->getAttributeValue(i) );
    }
  }
  nonfloatgroup = -1;		// We haven't seen any integer slots yet
  const List &flist(el->getChildren());
  List::const_iterator fiter;
  for(fiter=flist.begin();fiter!=flist.end();++fiter) {
    const Element *subel = *fiter;
    if (subel->getName() == "pentry") {
      entry.push_back(ParamEntry(numgroup));
      entry.back().restoreXml(subel,manage,normalstack);
      if (entry.back().getType()==TYPE_FLOAT) {
	  if (nonfloatgroup >= 0)
	    throw LowlevelError("parameter list floating-point entries must come first");
      }
      else if (nonfloatgroup < 0)
	nonfloatgroup = numgroup; // First time we have seen an integer slot
      AddrSpace *spc = entry.back().getSpace();
      if (spc->getType() == IPTR_SPACEBASE)
	spacebase = spc;
      else if (autokilledbycall)	// If a register parameter AND we automatically generate killedbycall
	effectlist.push_back(EffectRecord(entry.back(),EffectRecord::killedbycall));

      int4 maxgroup = entry.back().getGroup() + entry.back().getGroupSize();
      if (maxgroup > numgroup)
	numgroup = maxgroup;
      if (entry.back().getGroup() < lastgroup)
	throw LowlevelError("pentrys must come in group order");
      lastgroup = entry.back().getGroup();
    }
  }
  calcDelay();
  populateResolver();
}